

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_slopes.cpp
# Opt level: O3

void P_CopySlopes(void)

{
  double dVar1;
  line_t_conflict *plVar2;
  line_t_conflict *plVar3;
  line_t_conflict *plVar4;
  uint uVar5;
  sector_t_conflict *psVar6;
  sector_t_conflict **ppsVar7;
  sector_t_conflict *psVar8;
  sector_t_conflict **ppsVar9;
  ulong uVar10;
  long lVar11;
  
  if (0 < numlines) {
    lVar11 = 0;
    plVar2 = lines;
    plVar4 = lines;
    do {
      if (plVar4[lVar11].special == 0x76) {
        plVar4[lVar11].special = 0;
        plVar3 = plVar4 + lVar11;
        psVar8 = plVar4[lVar11].backsector;
        uVar10 = 0;
        do {
          if (plVar3->args[uVar10] != 0) {
            if ((uVar10 & 2) == 0) {
              psVar8 = plVar3->frontsector;
            }
            P_CopyPlane(plVar3->args[uVar10],psVar8,(bool)((byte)uVar10 & 1));
            plVar2 = lines;
          }
          uVar10 = uVar10 + 1;
          plVar3 = plVar2 + lVar11;
          psVar8 = plVar2[lVar11].backsector;
        } while (uVar10 < (ulong)(psVar8 != (sector_t_conflict *)0x0) * 2 + 2);
        plVar4 = plVar2;
        if (psVar8 != (sector_t_conflict *)0x0) {
          uVar5 = plVar3->args[4] & 3;
          if (uVar5 == 2) {
            psVar6 = plVar3->frontsector;
LAB_0045215d:
            (psVar6->floorplane).normal.Z = (psVar8->floorplane).normal.Z;
            dVar1 = (psVar8->floorplane).normal.Y;
            (psVar6->floorplane).normal.X = (psVar8->floorplane).normal.X;
            (psVar6->floorplane).normal.Y = dVar1;
            dVar1 = (psVar8->floorplane).negiC;
            (psVar6->floorplane).D = (psVar8->floorplane).D;
            (psVar6->floorplane).negiC = dVar1;
          }
          else if (uVar5 == 1) {
            psVar6 = psVar8;
            psVar8 = plVar3->frontsector;
            goto LAB_0045215d;
          }
          uVar5 = plVar3->args[4] & 0xc;
          if (uVar5 == 8) {
            ppsVar9 = &plVar3->frontsector;
            ppsVar7 = &plVar3->backsector;
          }
          else {
            if (uVar5 != 4) goto LAB_004521e8;
            ppsVar7 = &plVar3->frontsector;
            ppsVar9 = &plVar3->backsector;
          }
          psVar8 = *ppsVar7;
          psVar6 = *ppsVar9;
          (psVar6->ceilingplane).normal.Z = (psVar8->ceilingplane).normal.Z;
          dVar1 = (psVar8->ceilingplane).normal.Y;
          (psVar6->ceilingplane).normal.X = (psVar8->ceilingplane).normal.X;
          (psVar6->ceilingplane).normal.Y = dVar1;
          dVar1 = (psVar8->ceilingplane).negiC;
          (psVar6->ceilingplane).D = (psVar8->ceilingplane).D;
          (psVar6->ceilingplane).negiC = dVar1;
        }
      }
LAB_004521e8:
      lVar11 = lVar11 + 1;
    } while (lVar11 < numlines);
  }
  return;
}

Assistant:

void P_CopySlopes()
{
	for (int i = 0; i < numlines; i++)
	{
		if (lines[i].special == Plane_Copy)
		{
			// The args are used for the tags of sectors to copy:
			// args[0]: front floor
			// args[1]: front ceiling
			// args[2]: back floor
			// args[3]: back ceiling
			// args[4]: copy slopes from one side of the line to the other.
			lines[i].special = 0;
			for (int s = 0; s < (lines[i].backsector ? 4 : 2); s++)
			{
				if (lines[i].args[s])
					P_CopyPlane(lines[i].args[s], 
					(s & 2 ? lines[i].backsector : lines[i].frontsector), s & 1);
			}

			if (lines[i].backsector != NULL)
			{
				if ((lines[i].args[4] & 3) == 1)
				{
					lines[i].backsector->floorplane = lines[i].frontsector->floorplane;
				}
				else if ((lines[i].args[4] & 3) == 2)
				{
					lines[i].frontsector->floorplane = lines[i].backsector->floorplane;
				}
				if ((lines[i].args[4] & 12) == 4)
				{
					lines[i].backsector->ceilingplane = lines[i].frontsector->ceilingplane;
				}
				else if ((lines[i].args[4] & 12) == 8)
				{
					lines[i].frontsector->ceilingplane = lines[i].backsector->ceilingplane;
				}
			}
		}
	}
}